

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MessageGenerator::GenerateClear
          (MessageGenerator *this,Printer *printer)

{
  bool bVar1;
  string *value;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  bVar1 = Params::generate_clear(this->params_);
  if (bVar1) {
    value = Descriptor::name_abi_cxx11_(this->descriptor_);
    io::Printer::Print(printer,"\npublic $classname$ clear() {\n","classname",value);
    io::Printer::Indent(printer);
    GenerateFieldInitializers(this,printer);
    io::Printer::Outdent(printer);
    io::Printer::Print(printer,"  return this;\n}\n");
  }
  return;
}

Assistant:

void MessageGenerator::GenerateClear(io::Printer* printer) {
  if (!params_.generate_clear()) {
    return;
  }
  printer->Print(
    "\n"
    "public $classname$ clear() {\n",
    "classname", descriptor_->name());
  printer->Indent();

  GenerateFieldInitializers(printer);

  printer->Outdent();
  printer->Print(
    "  return this;\n"
    "}\n");
}